

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void TPZSkylMatrix<double>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<double> *storage,TPZVec<double_*> *point)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int64_t dim;
  long lVar5;
  double local_30;
  
  lVar5 = skyline->fNElements;
  if (lVar5 < 1) {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar3 = lVar4;
      plVar1 = skyline->fStore + lVar2;
      lVar4 = lVar3 + lVar2;
      lVar2 = lVar2 + 1;
      lVar4 = (lVar4 + 1) - *plVar1;
    } while (lVar5 != lVar2);
    lVar2 = (lVar3 - *plVar1) + lVar2;
  }
  (*storage->_vptr_TPZVec[3])(storage,lVar2);
  local_30 = 0.0;
  TPZVec<double>::Fill(storage,&local_30,0,-1);
  (*point->_vptr_TPZVec[3])(point,lVar5 + 1);
  if (lVar5 == 0) {
    *point->fStore = (double *)0x0;
  }
  else {
    *point->fStore = storage->fStore;
    point->fStore[lVar5] = storage->fStore + lVar2;
  }
  if (0 < lVar5) {
    lVar2 = 8;
    do {
      *(long *)((long)point->fStore + lVar2) =
           *(long *)((long)point->fStore + lVar2 + -8) +
           *(long *)((long)skyline->fStore + lVar2 + -8) * -8 + lVar2;
      lVar2 = lVar2 + 8;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}